

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O2

void wallet::StartWallets(WalletContext *context)

{
  ArgsManager *this;
  Function f;
  Function f_00;
  bool bVar1;
  shared_ptr<wallet::CWallet> *pwallet;
  _Alloc_hider _Var2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  _Manager_type in_stack_ffffffffffffff80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              *)&local_48,context);
  for (_Var2._M_p = local_48._M_dataplus._M_p; _Var2._M_p != (pointer)local_48._M_string_length;
      _Var2._M_p = _Var2._M_p + 0x10) {
    CWallet::postInitProcess(*(CWallet **)_Var2._M_p);
  }
  _GLOBAL__N_1::std::
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
  ~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           *)&local_48);
  this = context->args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-flushwallet",&local_49);
  bVar1 = ArgsManager::GetBoolArg(this,&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp:164:42)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp:164:42)>
               ::_M_manager;
    f.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff70;
    f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff68;
    f.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff78;
    f._M_invoker = (_Invoker_type)in_stack_ffffffffffffff80;
    local_70._M_unused._M_object = context;
    CScheduler::scheduleEvery(context->scheduler,f,(milliseconds)&local_70);
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
  }
  f_00.super__Function_base._M_functor._8_8_ = context;
  f_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff68;
  f_00.super__Function_base._M_manager = (_Manager_type)0x0;
  f_00._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp:166:38)>
       ::_M_manager;
  CScheduler::scheduleEvery(context->scheduler,f_00,(milliseconds)&stack0xffffffffffffff70);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartWallets(WalletContext& context)
{
    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        pwallet->postInitProcess();
    }

    // Schedule periodic wallet flushes and tx rebroadcasts
    if (context.args->GetBoolArg("-flushwallet", DEFAULT_FLUSHWALLET)) {
        context.scheduler->scheduleEvery([&context] { MaybeCompactWalletDB(context); }, 500ms);
    }
    context.scheduler->scheduleEvery([&context] { MaybeResendWalletTxs(context); }, 1min);
}